

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpluginloader.cpp
# Opt level: O1

void __thiscall QPluginLoader::setFileName(QPluginLoader *this,QString *fileName)

{
  QArrayData *pQVar1;
  QString *pQVar2;
  int *piVar3;
  undefined1 this_00 [8];
  undefined8 uVar4;
  Data *pDVar5;
  qsizetype qVar6;
  bool bVar7;
  bool bVar8;
  CutResult CVar9;
  qsizetype qVar10;
  QLoggingCategory *pQVar11;
  QLibraryPrivate *pQVar12;
  QArrayData *pQVar13;
  storage_type *psVar14;
  long lVar15;
  char16_t *pcVar16;
  QFlagsStorage<QLibrary::LoadHint> loadHints;
  QString *pQVar17;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QFileInfo fi;
  QString *local_130;
  QString local_108;
  undefined1 local_f0 [8];
  undefined1 local_e8 [24];
  QString *pQStack_d0;
  qsizetype local_c8;
  QStringView local_b8;
  QStringView local_a8;
  QArrayDataPointer<QString> local_98;
  QArrayDataPointer<QString> local_80;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QStringView_&>,_QStringView_&>,_const_QStringView_&>,_const_QString_&>
  local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar12 = this->d;
  if (pQVar12 == (QLibraryPrivate *)0x0) {
    loadHints.i = 8;
  }
  else {
    loadHints.i = (pQVar12->loadHintsInt).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
                  _q_value.super___atomic_base<int>._M_i;
    QLibraryPrivate::release(pQVar12);
    this->d = (QLibraryPrivate *)0x0;
    this->did_load = false;
  }
  local_108.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_108.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_108.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  bVar7 = QDir::isRelativePath(fileName);
  if (!bVar7) {
    local_68.a.a.a.a.a._0_4_ = 0xaaaaaaaa;
    local_68.a.a.a.a.a._4_4_ = 0xaaaaaaaa;
    QFileInfo::QFileInfo((QFileInfo *)&local_68,fileName);
    bVar8 = QFileInfo::isFile((QFileInfo *)&local_68);
    if (bVar8) {
      QFileInfo::canonicalFilePath(&local_108,(QFileInfo *)&local_68);
      QFileInfo::~QFileInfo((QFileInfo *)&local_68);
      if (bVar8) goto LAB_002dfbda;
    }
    else {
      QFileInfo::~QFileInfo((QFileInfo *)&local_68);
    }
  }
  local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_98.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.a.a.a.a.a._0_4_ = 0;
  local_68.a.a.a.a.a._4_4_ = 0;
  local_68.a.a.a.a.b = L'\0';
  local_68.a.a.a.a._10_2_ = 0;
  local_68.a.a.a.a._12_4_ = 0;
  local_68.a.a.a.b._0_4_ = 0;
  local_68.a.a.a.b._4_4_ = 0;
  QLibraryPrivate::suffixes_sys((QStringList *)&local_98,(QString *)&local_68);
  piVar3 = (int *)CONCAT44(local_68.a.a.a.a.a._4_4_,local_68.a.a.a.a.a._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      QArrayData::deallocate
                ((QArrayData *)CONCAT44(local_68.a.a.a.a.a._4_4_,local_68.a.a.a.a.a._0_4_),2,0x10);
    }
  }
  local_68.a.a.a.a.a._0_4_ = 0;
  local_68.a.a.a.a.a._4_4_ = 0;
  local_68.a.a.a.a.b = L'\0';
  local_68.a.a.a.a._10_2_ = 0;
  local_68.a.a.a.a._12_4_ = 0;
  local_68.a.a.a.b._0_4_ = 0;
  local_68.a.a.a.b._4_4_ = 0;
  QtPrivate::QMovableArrayOps<QString>::emplace<QString>
            ((QMovableArrayOps<QString> *)&local_98,0,(QString *)&local_68);
  piVar3 = (int *)CONCAT44(local_68.a.a.a.a.a._4_4_,local_68.a.a.a.a.a._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      QArrayData::deallocate
                ((QArrayData *)CONCAT44(local_68.a.a.a.a.a._4_4_,local_68.a.a.a.a.a._0_4_),2,0x10);
    }
  }
  qVar10 = QString::lastIndexOf(fileName,(QChar)0x2f,-1,CaseSensitive);
  local_a8.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
  pcVar16 = (fileName->d).ptr;
  pQVar1 = (QArrayData *)(qVar10 + 1);
  local_80.d = (Data *)0xffffffffffffffff;
  local_68.a.a.a.a.a = (QString *)pQVar1;
  CVar9 = QtPrivate::QContainerImplHelper::mid
                    ((fileName->d).size,(qsizetype *)&local_68,(qsizetype *)&local_80);
  if (CVar9 == Null) {
    local_a8.m_size = 0;
    local_a8.m_data = (storage_type_conflict *)0x0;
  }
  else {
    local_a8.m_data = pcVar16 + (long)local_68.a.a.a.a.a;
    local_a8.m_size = (qsizetype)local_80.d;
  }
  if (bVar7) {
    local_b8.m_data = (fileName->d).ptr;
    pQVar13 = (QArrayData *)(fileName->d).size;
    local_b8.m_size = (qsizetype)pQVar1;
    if (pQVar13 < pQVar1) {
      local_b8.m_size = (qsizetype)pQVar13;
    }
  }
  else {
    local_b8.m_size = 0;
    local_b8.m_data = (char16_t *)0x0;
    pQVar13 = (QArrayData *)local_a8.m_data;
  }
  local_e8._16_8_ = (QArrayData *)0x0;
  pQStack_d0 = (QString *)0x0;
  local_c8 = 0;
  if (bVar7) {
    QCoreApplication::libraryPaths();
    qVar6 = local_80.size;
    pQVar17 = local_80.ptr;
    pDVar5 = local_80.d;
    qVar10 = local_c8;
    pQVar2 = pQStack_d0;
    uVar4 = local_e8._16_8_;
    local_80.d = (Data *)0x0;
    local_80.ptr = (QString *)0x0;
    local_80.size = 0;
    local_e8._16_8_ = pDVar5;
    pQStack_d0 = pQVar17;
    local_c8 = qVar6;
    local_68.a.a.a.a.a._0_4_ = (undefined4)uVar4;
    local_68.a.a.a.a.a._4_4_ = SUB84(uVar4,4);
    local_68.a.a.a.a.b = (char16_t)pQVar2;
    local_68.a.a.a.a._10_2_ = SUB82((ulong)pQVar2 >> 0x10,0);
    local_68.a.a.a.a._12_4_ = SUB84((ulong)pQVar2 >> 0x20,0);
    local_68.a.a.a.b._0_4_ = (undefined4)qVar10;
    local_68.a.a.a.b._4_4_ = (undefined4)((ulong)qVar10 >> 0x20);
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_68);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_80);
  }
  else {
    QString::left((QString *)&local_68,fileName,qVar10);
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)(local_e8 + 0x10),local_c8,(QString *)&local_68);
    QList<QString>::end((QList<QString> *)(local_e8 + 0x10));
    if ((QArrayData *)local_68.a.a.a.a.a != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)&(local_68.a.a.a.a.a)->d)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)&(local_68.a.a.a.a.a)->d)->_q_value).super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)&(local_68.a.a.a.a.a)->d)->_q_value).super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate((QArrayData *)local_68.a.a.a.a.a,2,0x10);
      }
    }
  }
  if (local_c8 != 0) {
    local_130 = pQStack_d0;
    pQVar2 = pQStack_d0 + local_c8;
    do {
      pQVar13 = (QArrayData *)0x0;
      do {
        local_e8._0_8_ = *(undefined8 *)(&DAT_006acd98 + (long)pQVar13);
        local_e8._8_8_ = *(undefined8 *)(&UNK_006acda0 + (long)pQVar13);
        bVar8 = false;
        bVar7 = (undefined1 *)local_98.size == (undefined1 *)0x0;
        if (!bVar7) {
          lVar15 = local_98.size * 0x18;
          pQVar17 = local_98.ptr;
          do {
            local_108.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_108.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_108.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
            local_68.a.a.a.a.a._0_4_ = SUB84(local_130,0);
            local_68.a.a.a.a.a._4_4_ = (undefined4)((ulong)local_130 >> 0x20);
            local_68.a.a.a.a.b = L'/';
            local_68.a.a.a.b = &local_b8;
            local_68.a.a.b = (QStringView *)local_e8;
            local_68.a.b = &local_a8;
            local_68.b = pQVar17;
            QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QStringView_&>,_QStringView_&>,_const_QStringView_&>,_const_QString_&>
            ::convertTo<QString>(&local_108,&local_68);
            pQVar11 = QtPrivateLogging::qt_lcDebugPlugins();
            if (((pQVar11->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
              local_68.a.a.b = (QStringView *)pQVar11->name;
              local_68.a.a.a.a.a._0_4_ = 2;
              psVar14 = (storage_type *)((long)&local_68.a.a.a.a.a + 4);
              local_68.a.a.a.a.a._4_4_ = 0;
              local_68.a.a.a.a.b = L'\0';
              local_68.a.a.a.a._10_2_ = 0;
              local_68.a.a.a.a._12_4_ = 0;
              local_68.a.a.a.b._0_4_ = 0;
              local_68.a.a.a.b._4_4_ = 0;
              QMessageLogger::debug((QMessageLogger *)local_f0);
              this_00 = local_f0;
              ba.m_data = psVar14;
              ba.m_size = (qsizetype)"Trying...";
              QString::fromUtf8((QString *)&local_80,(QString *)0x9,ba);
              ::QTextStream::operator<<((QTextStream *)this_00,(QString *)&local_80);
              if (&(local_80.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_80.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_80.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                     -1;
                UNLOCK();
                if (((local_80.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                    0) {
                  QArrayData::deallocate(&(local_80.d)->super_QArrayData,2,0x10);
                }
              }
              if (*(bool *)((long)local_f0 + 0x30) == true) {
                ::QTextStream::operator<<((QTextStream *)local_f0,' ');
              }
              pcVar16 = local_108.d.ptr;
              if ((QChar *)local_108.d.ptr == (QChar *)0x0) {
                pcVar16 = L"";
              }
              QDebug::putString((QDebug *)local_f0,(QChar *)pcVar16,local_108.d.size);
              if (*(bool *)((long)local_f0 + 0x30) == true) {
                ::QTextStream::operator<<((QTextStream *)local_f0,' ');
              }
              QDebug::~QDebug((QDebug *)local_f0);
            }
            QFileInfo::QFileInfo((QFileInfo *)&local_68,&local_108);
            bVar8 = QFileInfo::isFile((QFileInfo *)&local_68);
            QFileInfo::~QFileInfo((QFileInfo *)&local_68);
            if (bVar8) {
              bVar8 = true;
              goto LAB_002dfa81;
            }
            if (&(local_108.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_108.d.d)->super_QArrayData,2,0x10);
              }
            }
            pQVar17 = pQVar17 + 1;
            lVar15 = lVar15 + -0x18;
            bVar7 = lVar15 == 0;
          } while (!bVar7);
          bVar8 = false;
        }
LAB_002dfa81:
        if (!bVar7) goto LAB_002dfa9a;
        pQVar13 = pQVar13 + 1;
      } while (pQVar13 != (QArrayData *)0x20);
      bVar8 = false;
LAB_002dfa9a:
      if (bVar8) goto LAB_002dfbb9;
      local_130 = local_130 + 1;
    } while (local_130 != pQVar2);
  }
  pQVar11 = QtPrivateLogging::qt_lcDebugPlugins();
  psVar14 = (storage_type *)CONCAT71((int7)((ulong)pQVar13 >> 8),*(byte *)&pQVar11->field_2);
  if ((*(byte *)&pQVar11->field_2 & 1) != 0) {
    local_68.a.a.b = (QStringView *)pQVar11->name;
    local_68.a.a.a.a.a._0_4_ = 2;
    local_68.a.a.a.a.a._4_4_ = 0;
    local_68.a.a.a.a.b = L'\0';
    local_68.a.a.a.a._10_2_ = 0;
    local_68.a.a.a.a._12_4_ = 0;
    local_68.a.a.a.b._0_4_ = 0;
    local_68.a.a.a.b._4_4_ = 0;
    QMessageLogger::debug((QMessageLogger *)local_e8);
    pcVar16 = (fileName->d).ptr;
    if ((QChar *)pcVar16 == (QChar *)0x0) {
      pcVar16 = L"";
    }
    QDebug::putString((QDebug *)local_e8,(QChar *)pcVar16,(fileName->d).size);
    if (*(bool *)(local_e8._0_8_ + 0x30) == true) {
      ::QTextStream::operator<<((QTextStream *)local_e8._0_8_,' ');
    }
    uVar4 = local_e8._0_8_;
    ba_00.m_data = psVar14;
    ba_00.m_size = (qsizetype)"not found";
    QString::fromUtf8((QString *)&local_80,(QString *)0x9,ba_00);
    ::QTextStream::operator<<((QTextStream *)uVar4,(QString *)&local_80);
    if (&(local_80.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_80.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_80.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_80.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_80.d)->super_QArrayData,2,0x10);
      }
    }
    if (*(bool *)(local_e8._0_8_ + 0x30) == true) {
      ::QTextStream::operator<<((QTextStream *)local_e8._0_8_,' ');
    }
    QDebug::~QDebug((QDebug *)local_e8);
  }
  local_108.d.d = (Data *)0x0;
  local_108.d.ptr = (char16_t *)0x0;
  local_108.d.size = 0;
LAB_002dfbb9:
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)(local_e8 + 0x10));
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_98);
LAB_002dfbda:
  local_68.a.a.a.a.a._0_4_ = 0;
  local_68.a.a.a.a.a._4_4_ = 0;
  local_68.a.a.a.a.b = L'\0';
  local_68.a.a.a.a._10_2_ = 0;
  local_68.a.a.a.a._12_4_ = 0;
  local_68.a.a.a.b._0_4_ = 0;
  local_68.a.a.a.b._4_4_ = 0;
  pQVar12 = QLibraryPrivate::findOrCreate(&local_108,(QString *)&local_68,(LoadHints)loadHints.i);
  this->d = pQVar12;
  piVar3 = (int *)CONCAT44(local_68.a.a.a.a.a._4_4_,local_68.a.a.a.a.a._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      QArrayData::deallocate
                ((QArrayData *)CONCAT44(local_68.a.a.a.a.a._4_4_,local_68.a.a.a.a.a._0_4_),2,0x10);
    }
  }
  if ((undefined1 *)local_108.d.size != (undefined1 *)0x0) {
    QLibraryPrivate::updatePluginState(this->d);
  }
  if (&(local_108.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_108.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPluginLoader::setFileName(const QString &fileName)
{
#if defined(QT_SHARED)
    QLibrary::LoadHints lh = defaultLoadHints;
    if (d) {
        lh = d->loadHints();
        d->release();
        d = nullptr;
        did_load = false;
    }

    const QString fn = locatePlugin(fileName);

    d = QLibraryPrivate::findOrCreate(fn, QString(), lh);
    if (!fn.isEmpty())
        d->updatePluginState();

#else
    qCWarning(qt_lcDebugPlugins, "Cannot load '%ls' into a statically linked Qt library.",
              qUtf16Printable(fileName));
#endif
}